

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_tpl_auto_escape.cc
# Opt level: O0

bool DiffTemplates(char *filename_a,char *filename_b,Strip strip)

{
  pointer *this;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  pointer pVVar4;
  pointer pVVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  byte local_14b;
  bool local_131;
  string local_f8 [39];
  byte local_d1;
  string local_d0 [32];
  __normal_iterator<VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
  local_b0;
  __normal_iterator<VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
  local_a8;
  __normal_iterator<VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
  local_a0;
  VariableAndMod *local_98;
  __normal_iterator<VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
  local_90;
  VariableAndMod *local_88;
  __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
  local_80;
  const_iterator iter_b;
  const_iterator iter_a;
  int no_modifiers_count;
  int mismatch_count;
  undefined1 local_58 [8];
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_b;
  vector<VariableAndMod,_std::allocator<VariableAndMod>_> vars_and_mods_a;
  Strip strip_local;
  char *filename_b_local;
  char *filename_a_local;
  
  this = &vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::vector
            ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)this);
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::vector
            ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
  bVar1 = LoadVariables(filename_a,strip,(VariableAndMods *)this);
  if ((bVar1) && (bVar1 = LoadVariables(filename_b,strip,(VariableAndMods *)local_58), bVar1)) {
    sVar2 = std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::size
                      ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
                       &vars_and_mods_b.
                        super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar3 = std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::size
                      ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
    if (sVar2 != sVar3) {
      sVar2 = std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::size
                        ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
                         &vars_and_mods_b.
                          super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      sVar3 = std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::size
                        ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
      LogPrintf(4,"Templates differ: %s [%d vars] vs. %s [%d vars].\n",filename_a,sVar2,filename_b,
                sVar3);
    }
    iter_a._M_current._4_4_ = 0;
    iter_a._M_current._0_4_ = 0;
    __gnu_cxx::
    __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
    ::__normal_iterator(&iter_b);
    __gnu_cxx::
    __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
    ::__normal_iterator(&local_80);
    local_90._M_current =
         (VariableAndMod *)
         std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::begin
                   ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
                    &vars_and_mods_b.
                     super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<VariableAndMod_const*,std::vector<VariableAndMod,std::allocator<VariableAndMod>>>
    ::__normal_iterator<VariableAndMod*>
              ((__normal_iterator<VariableAndMod_const*,std::vector<VariableAndMod,std::allocator<VariableAndMod>>>
                *)&local_88,&local_90);
    iter_b._M_current = local_88;
    local_a0._M_current =
         (VariableAndMod *)
         std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::begin
                   ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
    __gnu_cxx::
    __normal_iterator<VariableAndMod_const*,std::vector<VariableAndMod,std::allocator<VariableAndMod>>>
    ::__normal_iterator<VariableAndMod*>
              ((__normal_iterator<VariableAndMod_const*,std::vector<VariableAndMod,std::allocator<VariableAndMod>>>
                *)&local_98,&local_a0);
    local_80._M_current = local_98;
    while( true ) {
      local_a8._M_current =
           (VariableAndMod *)
           std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::end
                     ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
                      &vars_and_mods_b.
                       super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
      bVar1 = __gnu_cxx::operator!=(&iter_b,&local_a8);
      local_131 = false;
      if (bVar1) {
        local_b0._M_current =
             (VariableAndMod *)
             std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::end
                       ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
        local_131 = __gnu_cxx::operator!=(&local_80,&local_b0);
      }
      if (local_131 == false) break;
      pVVar4 = __gnu_cxx::
               __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
               ::operator->(&iter_b);
      pVVar5 = __gnu_cxx::
               __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
               ::operator->(&local_80);
      bVar1 = std::operator!=(&pVVar4->variable_name,&pVVar5->variable_name);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
        ::operator->(&iter_b);
        uVar6 = std::__cxx11::string::c_str();
        __gnu_cxx::
        __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
        ::operator->(&local_80);
        uVar7 = std::__cxx11::string::c_str();
        LogPrintf(4,"Variable name mismatch: %s vs. %s\n",uVar6,uVar7);
      }
      pVVar4 = __gnu_cxx::
               __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
               ::operator->(&iter_b);
      bVar1 = std::operator==(&pVVar4->modifiers,"");
      if (bVar1) {
LAB_00104cd5:
        iter_a._M_current._0_4_ = (uint)iter_a._M_current + 1;
      }
      else {
        pVVar4 = __gnu_cxx::
                 __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
                 ::operator->(&local_80);
        bVar1 = std::operator==(&pVVar4->modifiers,"");
        if (bVar1) goto LAB_00104cd5;
        pVVar4 = __gnu_cxx::
                 __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
                 ::operator->(&iter_b);
        pVVar5 = __gnu_cxx::
                 __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
                 ::operator->(&local_80);
        bVar1 = std::operator!=(&pVVar4->modifiers,&pVVar5->modifiers);
        local_d1 = 0;
        local_14b = 0;
        if (bVar1) {
          pVVar4 = __gnu_cxx::
                   __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
                   ::operator->(&iter_b);
          std::__cxx11::string::string(local_d0,(string *)&pVVar4->modifiers);
          local_d1 = 1;
          pVVar4 = __gnu_cxx::
                   __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
                   ::operator->(&local_80);
          std::__cxx11::string::string(local_f8,(string *)&pVVar4->modifiers);
          bVar1 = SuppressLameDiff((string *)local_d0,(string *)local_f8);
          local_14b = bVar1 ^ 0xff;
          std::__cxx11::string::~string(local_f8);
        }
        if ((local_d1 & 1) != 0) {
          std::__cxx11::string::~string(local_d0);
        }
        if ((local_14b & 1) != 0) {
          iter_a._M_current._4_4_ = iter_a._M_current._4_4_ + 1;
          __gnu_cxx::
          __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
          ::operator->(&iter_b);
          uVar6 = std::__cxx11::string::c_str();
          __gnu_cxx::
          __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
          ::operator->(&iter_b);
          uVar7 = std::__cxx11::string::c_str();
          __gnu_cxx::
          __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
          ::operator->(&local_80);
          uVar8 = std::__cxx11::string::c_str();
          LogPrintf(1,"Difference for variable %s -- %s vs. %s\n",uVar6,uVar7,uVar8);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
      ::operator++(&iter_b);
      __gnu_cxx::
      __normal_iterator<const_VariableAndMod_*,_std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>_>
      ::operator++(&local_80);
    }
    sVar2 = std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::size
                      ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
                       &vars_and_mods_b.
                        super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    LogPrintf(0,"Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",sVar2,
              (ulong)iter_a._M_current._4_4_,(ulong)(uint)iter_a._M_current);
    filename_a_local._7_1_ = iter_a._M_current._4_4_ == 0;
  }
  else {
    filename_a_local._7_1_ = false;
  }
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector
            ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)local_58);
  std::vector<VariableAndMod,_std::allocator<VariableAndMod>_>::~vector
            ((vector<VariableAndMod,_std::allocator<VariableAndMod>_> *)
             &vars_and_mods_b.super__Vector_base<VariableAndMod,_std::allocator<VariableAndMod>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return filename_a_local._7_1_;
}

Assistant:

bool DiffTemplates(const char* filename_a, const char* filename_b,
                   Strip strip) {
  vector<VariableAndMod> vars_and_mods_a, vars_and_mods_b;

  if (!LoadVariables(filename_a, strip, vars_and_mods_a) ||
      !LoadVariables(filename_b, strip, vars_and_mods_b))
    return false;

  if (vars_and_mods_a.size() != vars_and_mods_b.size())
    LogPrintf(LOG_FATAL, "Templates differ: %s [%d vars] vs. %s [%d vars].\n",
              filename_a, vars_and_mods_a.size(),
              filename_b, vars_and_mods_b.size());

  int mismatch_count = 0;      // How many differences there were.
  int no_modifiers_count = 0;  // How many variables without modifiers.
  VariableAndMods::const_iterator iter_a, iter_b;
  for (iter_a = vars_and_mods_a.begin(), iter_b = vars_and_mods_b.begin();
       iter_a != vars_and_mods_a.end() && iter_b != vars_and_mods_b.end();
       ++iter_a, ++iter_b) {
    // The templates have different variables, we fail!
    if (iter_a->variable_name != iter_b->variable_name)
      LogPrintf(LOG_FATAL, "Variable name mismatch: %s vs. %s\n",
                iter_a->variable_name.c_str(),
                iter_b->variable_name.c_str());
    // Variables without modifiers are ignored from the diff. They simply
    // get counted and the count is shown in verbose logging/
    if (iter_a->modifiers == "" || iter_b->modifiers == "") {
      no_modifiers_count++;
    } else {
      if (iter_a->modifiers != iter_b->modifiers &&
          !SuppressLameDiff(iter_a->modifiers, iter_b->modifiers)) {
        mismatch_count++;
        LogPrintf(LOG_INFO, "Difference for variable %s -- %s vs. %s\n",
                  iter_a->variable_name.c_str(),
                  iter_a->modifiers.c_str(), iter_b->modifiers.c_str());
      }
    }
  }

  LogPrintf(LOG_VERBOSE, "Variables Found: Total=%d; Diffs=%d; NoMods=%d\n",
            vars_and_mods_a.size(), mismatch_count, no_modifiers_count);

  return (mismatch_count == 0);
}